

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,_ImPlot::TransformerLogLin>::
operator()(RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,_ImPlot::TransformerLogLin> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  uint uVar10;
  GetterHeatmap<unsigned_long_long> *pGVar11;
  TransformerLogLin *pTVar12;
  ImPlotPlot *pIVar13;
  ImDrawVert *pIVar14;
  ImDrawIdx *pIVar15;
  ImVec2 IVar16;
  double dVar17;
  ImPlotContext *pIVar18;
  ImPlotContext *pIVar19;
  bool bVar20;
  bool bVar21;
  ImDrawIdx IVar22;
  ImU32 IVar23;
  float fVar24;
  double dVar25;
  double dVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  double dVar31;
  ImVec2 IVar32;
  
  pGVar11 = this->Getter;
  dVar26 = (pGVar11->HalfSize).x;
  dVar2 = (pGVar11->HalfSize).y;
  dVar31 = (double)(prim % pGVar11->Cols) * pGVar11->Width + pGVar11->XRef + dVar26;
  dVar17 = ((double)(prim / pGVar11->Cols) * pGVar11->Height + dVar2) * pGVar11->YDir +
           pGVar11->YRef;
  fVar24 = (float)(((((double)CONCAT44(0x45300000,(int)(pGVar11->Values[prim] >> 0x20)) -
                     1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)pGVar11->Values[prim]) - 4503599627370496.0))
                   - pGVar11->ScaleMin) / (pGVar11->ScaleMax - pGVar11->ScaleMin));
  fVar30 = 1.0;
  if (fVar24 <= 1.0) {
    fVar30 = fVar24;
  }
  IVar23 = ImPlotColormapData::LerpTable
                     (&GImPlot->ColormapData,(GImPlot->Style).Colormap,
                      (float)(~-(uint)(fVar24 < 0.0) & (uint)fVar30));
  pIVar18 = GImPlot;
  pTVar12 = this->Transformer;
  dVar25 = log10((dVar31 - dVar26) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar19 = GImPlot;
  dVar3 = pIVar18->LogDenX;
  pIVar13 = pIVar18->CurrentPlot;
  dVar4 = (pIVar13->XAxis).Range.Min;
  dVar5 = (pIVar13->XAxis).Range.Max;
  iVar9 = pTVar12->YAxis;
  dVar6 = pIVar13->YAxis[iVar9].Range.Min;
  dVar7 = pIVar18->My[iVar9];
  fVar30 = pIVar18->PixelRange[iVar9].Min.x;
  dVar8 = pIVar18->Mx;
  fVar24 = pIVar18->PixelRange[iVar9].Min.y;
  pTVar12 = this->Transformer;
  dVar26 = log10((dVar31 + dVar26) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  if (IVar23 < 0x1000000) {
    bVar21 = false;
  }
  else {
    fVar27 = (float)(((dVar17 - dVar2) - dVar6) * dVar7 + (double)fVar24);
    pIVar13 = pIVar19->CurrentPlot;
    iVar9 = pTVar12->YAxis;
    fVar28 = (float)(((dVar2 + dVar17) - pIVar13->YAxis[iVar9].Range.Min) * pIVar19->My[iVar9] +
                    (double)pIVar19->PixelRange[iVar9].Min.y);
    fVar24 = fVar27;
    if (fVar28 <= fVar27) {
      fVar24 = fVar28;
    }
    bVar20 = false;
    bVar21 = false;
    if ((fVar24 < (cull_rect->Max).y) &&
       (fVar24 = (float)(~-(uint)(fVar28 <= fVar27) & (uint)fVar28 |
                        -(uint)(fVar28 <= fVar27) & (uint)fVar27), pfVar1 = &(cull_rect->Min).y,
       bVar21 = bVar20, *pfVar1 <= fVar24 && fVar24 != *pfVar1)) {
      fVar29 = (float)((((double)(float)(dVar25 / dVar3) * (dVar5 - dVar4) + dVar4) - dVar4) * dVar8
                      + (double)fVar30);
      dVar2 = (pIVar13->XAxis).Range.Min;
      fVar24 = (float)((((double)(float)(dVar26 / pIVar19->LogDenX) *
                         ((pIVar13->XAxis).Range.Max - dVar2) + dVar2) - dVar2) * pIVar19->Mx +
                      (double)pIVar19->PixelRange[iVar9].Min.x);
      fVar30 = fVar29;
      if (fVar24 <= fVar29) {
        fVar30 = fVar24;
      }
      if ((fVar30 < (cull_rect->Max).x) &&
         (fVar30 = (float)(~-(uint)(fVar24 <= fVar29) & (uint)fVar24 |
                          -(uint)(fVar24 <= fVar29) & (uint)fVar29),
         (cull_rect->Min).x <= fVar30 && fVar30 != (cull_rect->Min).x)) {
        IVar32.y = fVar27;
        IVar32.x = fVar29;
        DrawList->_VtxWritePtr->pos = IVar32;
        DrawList->_VtxWritePtr->uv = *uv;
        pIVar14 = DrawList->_VtxWritePtr;
        pIVar14->col = IVar23;
        pIVar14[1].pos.x = fVar29;
        pIVar14[1].pos.y = fVar28;
        pIVar14[1].uv = *uv;
        pIVar14 = DrawList->_VtxWritePtr;
        pIVar14[1].col = IVar23;
        IVar16.y = fVar28;
        IVar16.x = fVar24;
        pIVar14[2].pos = IVar16;
        DrawList->_VtxWritePtr[2].uv = *uv;
        pIVar14 = DrawList->_VtxWritePtr;
        pIVar14[2].col = IVar23;
        pIVar14[3].pos.x = fVar24;
        pIVar14[3].pos.y = fVar27;
        pIVar14[3].uv = *uv;
        pIVar14 = DrawList->_VtxWritePtr;
        pIVar14[3].col = IVar23;
        DrawList->_VtxWritePtr = pIVar14 + 4;
        uVar10 = DrawList->_VtxCurrentIdx;
        pIVar15 = DrawList->_IdxWritePtr;
        IVar22 = (ImDrawIdx)uVar10;
        *pIVar15 = IVar22;
        pIVar15[1] = IVar22 + 1;
        pIVar15[2] = IVar22 + 3;
        pIVar15[3] = IVar22 + 1;
        pIVar15[4] = IVar22 + 2;
        pIVar15[5] = IVar22 + 3;
        DrawList->_IdxWritePtr = pIVar15 + 6;
        DrawList->_VtxCurrentIdx = uVar10 + 4;
        bVar21 = true;
      }
    }
  }
  return bVar21;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        RectInfo rect = Getter(prim);
        ImVec2 P1 = Transformer(rect.Min);
        ImVec2 P2 = Transformer(rect.Max);

        if ((rect.Color & IM_COL32_A_MASK) == 0 || !cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;

        DrawList._VtxWritePtr[0].pos   = P1;
        DrawList._VtxWritePtr[0].uv    = uv;
        DrawList._VtxWritePtr[0].col   = rect.Color;
        DrawList._VtxWritePtr[1].pos.x = P1.x;
        DrawList._VtxWritePtr[1].pos.y = P2.y;
        DrawList._VtxWritePtr[1].uv    = uv;
        DrawList._VtxWritePtr[1].col   = rect.Color;
        DrawList._VtxWritePtr[2].pos   = P2;
        DrawList._VtxWritePtr[2].uv    = uv;
        DrawList._VtxWritePtr[2].col   = rect.Color;
        DrawList._VtxWritePtr[3].pos.x = P2.x;
        DrawList._VtxWritePtr[3].pos.y = P1.y;
        DrawList._VtxWritePtr[3].uv    = uv;
        DrawList._VtxWritePtr[3].col   = rect.Color;
        DrawList._VtxWritePtr += 4;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 2);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr   += 6;
        DrawList._VtxCurrentIdx += 4;
        return true;
    }